

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-3339_type.h
# Opt level: O1

bool date::rfc3339::write<std::ostreambuf_iterator<char,std::char_traits<char>>>
               (parts *dt,ostreambuf_iterator<char,_std::char_traits<char>_> *dst)

{
  bool bVar1;
  
  bVar1 = validate(dt);
  if (bVar1) {
    number_writer<4>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_short>
              (dst,dt->year);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,'-');
    number_writer<2>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_char>
              (dst,dt->month);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,'-');
    number_writer<2>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_char>
              (dst,dt->day);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,'T');
    number_writer<2>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_char>
              (dst,dt->hour);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,':');
    number_writer<2>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_char>
              (dst,dt->minute);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,':');
    number_writer<2>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_char>
              (dst,dt->second);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,'Z');
  }
  return bVar1;
}

Assistant:

static bool write(const parts& dt, Iterator& dst)
    {
        if (!validate(dt))
            return false;

        using char_type = typename iterator_traits<Iterator>::value_type;

        number_writer<4>::write(dst, dt.year);
        characters_writer::write(dst, char_type{ '-' });
        number_writer<2>::write(dst, dt.month);
        characters_writer::write(dst, char_type{ '-' });
        number_writer<2>::write(dst, dt.day);
        characters_writer::write(dst, char_type{ 'T' });
        number_writer<2>::write(dst, dt.hour);
        characters_writer::write(dst, char_type{ ':' });
        number_writer<2>::write(dst, dt.minute);
        characters_writer::write(dst, char_type{ ':' });
        number_writer<2>::write(dst, dt.second);
        characters_writer::write(dst, char_type{ 'Z' });

        return true;
    }